

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O1

bool __thiscall ON_Surface::IsCone(ON_Surface *this,ON_Cone *cone,double tolerance)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ON_3dPoint p;
  ON_3dPoint p_00;
  ON_3dPoint P_00;
  ON_3dPoint P_01;
  ON_3dPoint P_02;
  ON_3dPoint P_03;
  ON_3dPoint P_04;
  ON_3dPoint p_01;
  bool bVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  void *pvVar10;
  long lVar11;
  ON_Plane *pOVar12;
  ON_Plane *pOVar13;
  ON_Cone *pOVar14;
  void *memblock;
  uint uVar15;
  byte bVar16;
  ulong uVar17;
  double extraout_XMM0_Qa;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  ulong in_XMM0_Qb;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined1 auVar26 [16];
  ON_Line line;
  ON_3dPoint P;
  ON_Arc arc;
  double local_250;
  double local_228;
  ON_Line local_1f8;
  ON_3dPoint local_1c8;
  void *local_1b0;
  double local_1a8;
  undefined8 uStack_1a0;
  ulong local_190;
  ulong local_188;
  ulong local_180;
  ulong local_178;
  ON_3dVector local_170;
  ON_Cone local_158;
  ON_Plane local_c8;
  undefined8 local_48;
  double local_40;
  double dStack_38;
  ON_Curve *pOVar9;
  
  bVar16 = 0;
  bVar3 = ON_IsValid(tolerance);
  uVar23 = (undefined4)in_XMM0_Qb;
  uVar25 = (undefined4)(in_XMM0_Qb >> 0x20);
  dVar18 = tolerance;
  if (!bVar3) {
    dVar18 = 2.3283064365386963e-10;
    uVar23 = 0;
    uVar25 = 0;
  }
  uVar17 = (ulong)dVar18 & -(ulong)(0.0 < tolerance);
  uVar22 = (undefined4)uVar17;
  uVar24 = (undefined4)(uVar17 >> 0x20);
  uVar2 = CONCAT44(uVar25,uVar23) & in_XMM0_Qb;
  auVar26._0_8_ = ~-(ulong)(0.0 < tolerance) & 0x3df0000000000000;
  auVar26._8_8_ = 0;
  auVar1._8_4_ = (int)uVar2;
  auVar1._0_8_ = uVar17;
  auVar1._12_4_ = (int)(uVar2 >> 0x20);
  auVar26 = auVar26 | auVar1;
  bVar3 = ON_Object::IsKindOf((ON_Object *)this,&ON_RevSurface::m_ON_RevSurface_class_rtti);
  local_228 = auVar26._0_8_;
  if (bVar3) {
    bVar3 = ON_RevSurface::IsConical((ON_RevSurface *)this,cone,local_228);
    return bVar3;
  }
  (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(this,1);
  local_c8.origin.y = (double)CONCAT44(uVar24,uVar22);
  ON_Interval::Mid((ON_Interval *)&local_c8);
  iVar6 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x38])(this,0);
  pOVar9 = (ON_Curve *)CONCAT44(extraout_var,iVar6);
  if (pOVar9 == (ON_Curve *)0x0) {
    return false;
  }
  pOVar12 = &ON_Plane::World_xy;
  pOVar13 = &local_c8;
  for (lVar11 = 0x10; lVar11 != 0; lVar11 = lVar11 + -1) {
    (pOVar13->origin).x = (pOVar12->origin).x;
    pOVar12 = (ON_Plane *)((long)pOVar12 + ((ulong)bVar16 * -2 + 1) * 8);
    pOVar13 = (ON_Plane *)((long)pOVar13 + ((ulong)bVar16 * -2 + 1) * 8);
  }
  local_48 = 0x3ff0000000000000;
  local_40 = ON_Interval::ZeroToTwoPi.m_t[0];
  dStack_38 = ON_Interval::ZeroToTwoPi.m_t[1];
  ON_Line::ON_Line(&local_1f8);
  uVar23 = auVar26._0_4_;
  uVar25 = auVar26._4_4_;
  uVar17 = -(ulong)(2.3283064365386963e-10 < local_228) & (ulong)local_228;
  iVar6 = (*(pOVar9->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x30])(pOVar9,0,&local_c8);
  bVar4 = (byte)iVar6;
  if (bVar4 == 0) {
    iVar6 = (*(pOVar9->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x2e])(uVar17,pOVar9);
    bVar5 = (byte)iVar6;
    if (bVar5 != 0) {
      ON_Curve::PointAtStart((ON_3dPoint *)&local_158,pOVar9);
      local_1f8.from.z = local_158.plane.origin.z;
      local_1f8.from.x = local_158.plane.origin.x;
      local_1f8.from.y = local_158.plane.origin.y;
      ON_Curve::PointAtEnd((ON_3dPoint *)&local_158,pOVar9);
      local_1f8.to.z = local_158.plane.origin.z;
      local_1f8.to.x = local_158.plane.origin.x;
      local_1f8.to.y = local_158.plane.origin.y;
    }
  }
  else {
    bVar5 = 0;
  }
  (*(pOVar9->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])(pOVar9);
  if ((bVar4 | bVar5) == 1) {
    (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(this,0);
    local_158.plane.origin.y = (double)CONCAT44(uVar25,uVar23);
    local_158.plane.origin.x = extraout_XMM0_Qa;
    ON_Interval::Mid((ON_Interval *)&local_158);
    iVar6 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x38])(this,1);
    pOVar9 = (ON_Curve *)CONCAT44(extraout_var_00,iVar6);
    if (pOVar9 != (ON_Curve *)0x0) {
      if (bVar4 == 0) {
        iVar6 = (*(pOVar9->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x30])
                          (uVar17,pOVar9,0,&local_c8);
        bVar4 = (byte)iVar6;
      }
      else if (bVar5 == 0) {
        iVar6 = (*(pOVar9->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x2e])(uVar17,pOVar9);
        bVar5 = (byte)iVar6;
        if (bVar5 != 0) {
          ON_Curve::PointAtStart((ON_3dPoint *)&local_158,pOVar9);
          local_1f8.from.z = local_158.plane.origin.z;
          local_1f8.from.x = local_158.plane.origin.x;
          local_1f8.from.y = local_158.plane.origin.y;
          ON_Curve::PointAtEnd((ON_3dPoint *)&local_158,pOVar9);
          local_1f8.to.z = local_158.plane.origin.z;
          local_1f8.to.x = local_158.plane.origin.x;
          local_1f8.to.y = local_158.plane.origin.y;
        }
      }
      else {
        bVar5 = 1;
      }
      (*(pOVar9->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])(pOVar9);
      bVar3 = false;
      if ((bVar4 == 0) || (bVar3 = false, bVar5 == 0)) goto LAB_005acc2a;
      p.y = local_1f8.from.y;
      p.x = local_1f8.from.x;
      p.z = local_1f8.from.z;
      ON_Plane::ClosestPointTo((ON_3dPoint *)&local_158,&local_c8,p);
      dVar18 = ON_3dPoint::DistanceTo(&local_c8.origin,(ON_3dPoint *)&local_158);
      p_00.y = local_1f8.to.y;
      p_00.x = local_1f8.to.x;
      p_00.z = local_1f8.to.z;
      ON_Plane::ClosestPointTo((ON_3dPoint *)&local_158,&local_c8,p_00);
      dVar19 = ON_3dPoint::DistanceTo(&local_c8.origin,(ON_3dPoint *)&local_158);
      if (2.3283064365386963e-10 < ABS(dVar18 - dVar19)) {
        P_00.y = local_1f8.from.y;
        P_00.x = local_1f8.from.x;
        P_00.z = local_1f8.from.z;
        dVar20 = ON_PlaneEquation::ValueAt(&local_c8.plane_equation,P_00);
        P_01.y = local_1f8.to.y;
        P_01.x = local_1f8.to.x;
        P_01.z = local_1f8.to.z;
        local_250 = ON_PlaneEquation::ValueAt(&local_c8.plane_equation,P_01);
        if (2.3283064365386963e-10 < ABS(dVar20 - local_250)) {
          ON_Cone::ON_Cone(&local_158);
          local_158.height = (dVar20 * dVar19 - local_250 * dVar18) / (dVar19 - dVar18);
          bVar3 = ON_IsValid(local_158.height);
          dVar21 = local_158.height;
          if ((!bVar3) || (ABS(local_158.height) <= 2.3283064365386963e-10)) {
LAB_005acc17:
            bVar3 = false;
          }
          else {
            pOVar12 = &local_c8;
            pOVar14 = &local_158;
            for (lVar11 = 0x10; lVar11 != 0; lVar11 = lVar11 + -1) {
              (pOVar14->plane).origin.x = (pOVar12->origin).x;
              pOVar12 = (ON_Plane *)((long)pOVar12 + ((ulong)bVar16 * -2 + 1) * 8);
              pOVar14 = (ON_Cone *)((long)pOVar14 + ((ulong)bVar16 * -2 + 1) * 8);
            }
            ::operator*(&local_170,dVar21,&local_158.plane.zaxis);
            ON_3dPoint::operator+(&local_1c8,(ON_3dPoint *)&local_158,&local_170);
            local_158.plane.origin.z = local_1c8.z;
            local_158.plane.origin.x = local_1c8.x;
            local_158.plane.origin.y = local_1c8.y;
            ON_Plane::UpdateEquation(&local_158.plane);
            local_158.radius =
                 (double)(~-(ulong)(dVar18 < dVar19) & (ulong)dVar18 |
                         -(ulong)(dVar18 < dVar19) & (ulong)dVar19);
            if (dVar19 <= dVar18) {
              local_250 = dVar20;
            }
            local_158.height = local_250 - local_158.height;
            bVar3 = ON_Cone::IsValid(&local_158);
            dVar20 = local_158.height;
            if (!bVar3) goto LAB_005acc17;
            P_02.y = local_1f8.from.y;
            P_02.x = local_1f8.from.x;
            P_02.z = local_1f8.from.z;
            dVar21 = ON_PlaneEquation::ValueAt(&local_158.plane.plane_equation,P_02);
            local_1a8 = (dVar18 + dVar19) * 7.450580596925e-09;
            dVar20 = ABS(dVar20) * local_1a8;
            if ((dVar20 < ABS(local_158.height * dVar18 - dVar21 * local_158.radius)) ||
               (P_03.y = local_1f8.to.y, P_03.x = local_1f8.to.x, P_03.z = local_1f8.to.z,
               dVar18 = ON_PlaneEquation::ValueAt(&local_158.plane.plane_equation,P_03),
               dVar20 < ABS(local_158.height * dVar19 - dVar18 * local_158.radius)))
            goto LAB_005acc17;
            uVar7 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x28])(this,0);
            uVar8 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x28])(this,1);
            pvVar10 = onmalloc((long)(int)(uVar7 + uVar8 + 2) << 3);
            (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x29])(this,0,pvVar10);
            (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x29])(this,1);
            bVar3 = (int)uVar7 < 1;
            memblock = pvVar10;
            if (0 < (int)uVar7) {
              if (local_228 <= local_1a8) {
                local_228 = local_1a8;
              }
              local_1a8 = ABS(local_158.height) * local_228;
              uStack_1a0 = 0;
              local_190 = (ulong)uVar7;
              uVar17 = 0;
              local_1b0 = pvVar10;
              local_188 = (ulong)uVar8;
              local_178 = (ulong)uVar8;
              do {
                uVar8 = (uint)(uVar17 != 0);
                local_180 = uVar17;
                do {
                  dVar18 = *(double *)((long)local_1b0 + local_180 * 8 + 8);
                  dVar19 = *(double *)((long)local_1b0 + local_180 * 8);
                  if (0 < (int)local_188) {
                    uVar17 = 0;
                    do {
                      uVar15 = (uint)(uVar17 != 0);
                      iVar6 = 4 - (uint)(uVar17 != 0);
                      do {
                        PointAt((ON_3dPoint *)&local_170,this,
                                ((double)(int)(4 - uVar8) * dVar19 + (double)(int)uVar8 * dVar18) *
                                0.25,((double)iVar6 *
                                      *(double *)
                                       ((long)pvVar10 + uVar17 * 8 + (long)(int)uVar7 * 8 + 8) +
                                     (double)(int)uVar15 *
                                     *(double *)
                                      ((long)pvVar10 + uVar17 * 8 + (long)(int)uVar7 * 8 + 0x10)) *
                                     0.25);
                        local_1c8.z = local_170.z;
                        local_1c8.x = local_170.x;
                        local_1c8.y = local_170.y;
                        P_04.y = local_170.y;
                        P_04.x = local_170.x;
                        P_04.z = local_170.z;
                        dVar20 = ON_PlaneEquation::ValueAt(&local_158.plane.plane_equation,P_04);
                        p_01.y = local_1c8.y;
                        p_01.x = local_1c8.x;
                        p_01.z = local_1c8.z;
                        ON_Plane::ClosestPointTo((ON_3dPoint *)&local_170,&local_158.plane,p_01);
                        dVar21 = ON_3dPoint::DistanceTo
                                           ((ON_3dPoint *)&local_158,(ON_3dPoint *)&local_170);
                        if (local_1a8 < ABS(dVar21 * local_158.height - dVar20 * local_158.radius))
                        {
                          onfree(local_1b0);
                          goto LAB_005acc19;
                        }
                        uVar15 = uVar15 + 1;
                        iVar6 = iVar6 + -1;
                      } while (uVar15 != 5);
                      uVar17 = uVar17 + 1;
                    } while (uVar17 != local_178);
                  }
                  uVar8 = uVar8 + 1;
                } while (uVar8 != 5);
                uVar17 = local_180 + 1;
                bVar3 = local_190 <= uVar17;
                memblock = local_1b0;
              } while (uVar17 != local_190);
            }
            onfree(memblock);
            if (cone != (ON_Cone *)0x0) {
              memcpy(cone,&local_158,0x90);
            }
          }
LAB_005acc19:
          ON_Cone::~ON_Cone(&local_158);
          goto LAB_005acc2a;
        }
      }
    }
  }
  bVar3 = false;
LAB_005acc2a:
  ON_Line::~ON_Line(&local_1f8);
  ON_Plane::~ON_Plane(&local_c8);
  return bVar3;
}

Assistant:

bool ON_Surface::IsCone( ON_Cone* cone, double tolerance ) const
{
  if ( !ON_IsValid(tolerance) || tolerance <= 0.0 )
    tolerance = ON_ZERO_TOLERANCE;

  const ON_RevSurface* rs = ON_RevSurface::Cast(this);
  if (rs)
  {
    return rs->IsConical(cone,tolerance) ? true : false;
  }


  ON_Curve* crv = IsoCurve(0,Domain(1).Mid());
  if ( !crv )
    return false;

  ON_Arc arc;
  ON_Line line;
  int bIsLine = 0;
  int bIsArc = crv->IsArc(0,&arc,tolerance > ON_ZERO_TOLERANCE ? tolerance : 0.0);
  if ( !bIsArc )
  {
    bIsLine = crv->IsLinear(tolerance > ON_ZERO_TOLERANCE ? tolerance : 0.0);
    if ( bIsLine )
    {
      line.from = crv->PointAtStart();
      line.to = crv->PointAtEnd();
    }
  }
  delete crv;
  crv = 0;
  if ( !bIsArc && !bIsLine )
    return false;

  crv = IsoCurve(1,Domain(0).Mid());
  if ( !crv )
    return false;
  if ( !bIsArc )
    bIsArc = crv->IsArc(0,&arc,tolerance > ON_ZERO_TOLERANCE ? tolerance : 0.0);
  else if ( !bIsLine )
  {
    bIsLine = crv->IsLinear(tolerance > ON_ZERO_TOLERANCE ? tolerance : 0.0);
    if ( bIsLine )
    {
      line.from = crv->PointAtStart();
      line.to = crv->PointAtEnd();
    }
  }
  delete crv;
  crv = 0;
  if ( !bIsArc || !bIsLine )
    return false;

  double r0 = arc.plane.origin.DistanceTo(arc.plane.ClosestPointTo(line.from));
  double r1 = arc.plane.origin.DistanceTo(arc.plane.ClosestPointTo(line.to));
  if ( fabs(r0-r1) <= ON_ZERO_TOLERANCE )
    return false;
  double h0 = arc.plane.plane_equation.ValueAt(line.from);
  double h1 = arc.plane.plane_equation.ValueAt(line.to);
  if ( fabs(h0-h1) <= ON_ZERO_TOLERANCE )
    return false;
  double tol = 0.5*ON_SQRT_EPSILON*(r0+r1);

  ON_Cone cn;
  cn.height = (h0*r1 - r0*h1)/(r1-r0);
  if ( !ON_IsValid(cn.height) || fabs(cn.height) <= ON_ZERO_TOLERANCE )
    return false;
  cn.plane = arc.plane;
  cn.plane.origin = cn.plane.origin + cn.height*cn.plane.zaxis;
  cn.plane.UpdateEquation();
  if ( r0 >= r1 )
  {
    cn.radius = r0;
    cn.height = h0-cn.height;
  }
  else
  {
    cn.radius = r1;
    cn.height = h1-cn.height;
  }
  if ( !cn.IsValid() )
    return false;
  tol *= fabs(cn.height);

  // if (r - h*cn.radius/cn.height > tolerance) return false;
  double h = cn.plane.plane_equation.ValueAt(line.from);
  if ( fabs(r0*cn.height - h*cn.radius) > tol )
    return false;
  h = cn.plane.plane_equation.ValueAt(line.to);
  if ( fabs(r1*cn.height - h*cn.radius) > tol )
    return false;

  ON_3dPoint P;
  double u, v, r;
  int sc0 = SpanCount(0);
  int sc1 = SpanCount(1);
  double* s = (double*)onmalloc( (sc0+sc1+2)*sizeof(s[0]) );
  double* t = s + (sc0+1);
  GetSpanVector(0,s);
  GetSpanVector(1,t);
  tol = 0.5*ON_SQRT_EPSILON*(r0+r1);
  if ( tol < tolerance )
    tol = tolerance;
  tol *= fabs(cn.height);
  for ( int i = 0; i < sc0; i++ )
  {
    for ( int ii = i?1:0; ii <= 4; ii++ )
    {
      u = 0.25*((4-ii)*s[i] + ii*s[i+1]);
      for ( int j = 0; j < sc1; j++ )
      {
        for ( int jj = j?1:0; jj <= 4; jj++ )
        {
          v = 0.25*((4-jj)*t[j] + jj*t[j+1]);
          P = PointAt(u,v);
          h = cn.plane.plane_equation.ValueAt(P);
          r = cn.plane.origin.DistanceTo(cn.plane.ClosestPointTo(P));
          // if (r - h*cn.radius/cn.height > tolerance) return false;
          if ( fabs(r*cn.height - h*cn.radius) > tol )
          {
            onfree(s);
            return false;
          }
        }
      }
    }
  }
  onfree(s);

  if ( cone )
  {
    *cone = cn;
  }

  return true;
}